

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32WaveGenerator.cpp
# Opt level: O3

void __thiscall MT32Emu::LA32WaveGenerator::advancePosition(LA32WaveGenerator *this)

{
  undefined2 uVar1;
  Bit16u BVar2;
  Bit32u highLinearLength;
  uint effectiveCutoffValue;
  Bit32u resonanceWaveLengthFactor;
  
  uVar1 = this->pitch;
  BVar2 = LA32Utilites::interpolateExp(~uVar1 & 0xfff);
  this->wavePosition =
       (((uint)BVar2 << (byte)(this->pitch >> 0xc)) >> 8 & 0xffffe) + this->wavePosition & 0xfffff;
  effectiveCutoffValue = 0;
  if (0x2000000 < this->cutoffVal) {
    effectiveCutoffValue = this->cutoffVal + 0xfe000000 >> 10;
  }
  BVar2 = LA32Utilites::interpolateExp(~(ushort)effectiveCutoffValue & 0xfff);
  resonanceWaveLengthFactor = (uint)BVar2 << ((byte)(effectiveCutoffValue >> 0xc) & 0x1f);
  highLinearLength = getHighLinearLength(this,effectiveCutoffValue);
  computePositions(this,highLinearLength,
                   (resonanceWaveLengthFactor * 0x100 - highLinearLength) - 0x100000,
                   resonanceWaveLengthFactor);
  this->resonancePhase =
       (this->resonanceSinePosition >> 0x12) + (uint)(2 < (int)this->phase) * 2 &
       NEGATIVE_RISING_RESONANCE_SINE_SEGMENT;
  return;
}

Assistant:

void LA32WaveGenerator::advancePosition() {
	wavePosition += getSampleStep();
	wavePosition %= 4 * SINE_SEGMENT_RELATIVE_LENGTH;

	Bit32u effectiveCutoffValue = (cutoffVal > MIDDLE_CUTOFF_VALUE) ? (cutoffVal - MIDDLE_CUTOFF_VALUE) >> 10 : 0;
	Bit32u resonanceWaveLengthFactor = getResonanceWaveLengthFactor(effectiveCutoffValue);
	Bit32u highLinearLength = getHighLinearLength(effectiveCutoffValue);
	Bit32u lowLinearLength = (resonanceWaveLengthFactor << 8) - 4 * SINE_SEGMENT_RELATIVE_LENGTH - highLinearLength;
	computePositions(highLinearLength, lowLinearLength, resonanceWaveLengthFactor);

	resonancePhase = ResonancePhase(((resonanceSinePosition >> 18) + (phase > POSITIVE_FALLING_SINE_SEGMENT ? 2 : 0)) & 3);
}